

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_main.cpp
# Opt level: O2

void addterm(_func_void *func,char *name)

{
  long *plVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = 0;
  if (0 < NumTerms) {
    uVar3 = (ulong)(uint)NumTerms;
  }
  lVar2 = 0;
  do {
    if (uVar3 * 8 == lVar2) {
      if (NumTerms == 0x40) {
        (*func)();
        I_FatalError("Too many exit functions registered.\nIncrease MAX_TERMS in i_main.cpp");
      }
      TermNames[NumTerms] = name;
      lVar2 = (long)NumTerms;
      NumTerms = NumTerms + 1;
      TermFuncs[lVar2] = func;
      return;
    }
    plVar1 = (long *)((long)TermFuncs + lVar2);
    lVar2 = lVar2 + 8;
  } while ((_func_void *)*plVar1 != func);
  return;
}

Assistant:

void addterm (void (*func) (), const char *name)
{
	// Make sure this function wasn't already registered.
	for (int i = 0; i < NumTerms; ++i)
	{
		if (TermFuncs[i] == func)
		{
			return;
		}
	}
    if (NumTerms == MAX_TERMS)
	{
		func ();
		I_FatalError (
			"Too many exit functions registered.\n"
			"Increase MAX_TERMS in i_main.cpp");
	}
	TermNames[NumTerms] = name;
    TermFuncs[NumTerms++] = func;
}